

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

int plot_click(t_gobj *z,_glist *glist,t_word *data,t_template *template,t_scalar *sc,_array *ap,
              t_float basex,t_float basey,int xpix,int ypix,int shift,int alt,int dbl,int doit)

{
  int iVar1;
  _fielddesc *local_c0;
  _fielddesc *wfielddesc;
  _fielddesc *yfielddesc;
  _fielddesc *xfielddesc;
  _array *array;
  t_float edit;
  t_float scalarvis;
  t_float vis;
  t_float style;
  t_float yloc;
  t_float xinc;
  t_float xloc;
  t_float linewidth;
  t_symbol *elemtemplatesym;
  t_plot *x;
  t_float basey_local;
  t_float basex_local;
  _array *ap_local;
  t_scalar *sc_local;
  t_template *template_local;
  t_word *data_local;
  _glist *glist_local;
  t_gobj *z_local;
  
  elemtemplatesym = (t_symbol *)z;
  x._0_4_ = basey;
  x._4_4_ = basex;
  _basey_local = ap;
  ap_local = (_array *)sc;
  sc_local = (t_scalar *)template;
  template_local = (t_template *)data;
  data_local = (t_word *)glist;
  glist_local = (_glist *)z;
  iVar1 = plot_readownertemplate
                    ((t_plot *)z,data,template,(t_symbol **)&xloc,(_array **)&xfielddesc,&xinc,&yloc
                     ,&style,&vis,&scalarvis,&edit,(t_float *)((long)&array + 4),(t_float *)&array,
                     &yfielddesc,&wfielddesc,&local_c0);
  if ((iVar1 == 0) && ((edit != 0.0 || (NAN(edit))))) {
    z_local._4_4_ =
         array_doclick((_array *)xfielddesc,(_glist *)data_local,(t_scalar *)ap_local,_basey_local,
                       _xloc,x._4_4_ + yloc,style,x._0_4_ + vis,array._4_4_,array._0_4_,yfielddesc,
                       wfielddesc,local_c0,xpix,ypix,shift,alt,dbl,doit);
  }
  else {
    z_local._4_4_ = 0;
  }
  return z_local._4_4_;
}

Assistant:

static int plot_click(t_gobj *z, t_glist *glist,
    t_word *data, t_template *template, t_scalar *sc, t_array *ap,
    t_float basex, t_float basey,
    int xpix, int ypix, int shift, int alt, int dbl, int doit)
{
    t_plot *x = (t_plot *)z;
    t_symbol *elemtemplatesym;
    t_float linewidth, xloc, xinc, yloc, style, vis, scalarvis, edit;
    t_array *array;
    t_fielddesc *xfielddesc, *yfielddesc, *wfielddesc;

    if (!plot_readownertemplate(x, data, template,
        &elemtemplatesym, &array, &linewidth, &xloc, &xinc, &yloc, &style,
        &vis, &scalarvis, &edit,
        &xfielddesc, &yfielddesc, &wfielddesc) && (vis != 0))
    {
        return (array_doclick(array, glist, sc, ap, elemtemplatesym,
            basex + xloc, xinc, basey + yloc, scalarvis, edit,
            xfielddesc, yfielddesc, wfielddesc,
            xpix, ypix, shift, alt, dbl, doit));
    }
    else return (0);
}